

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::eraseImpl
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this,
          size_t pos)

{
  size_t sVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  uint row;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  long local_60;
  SearchKey local_58;
  Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *local_50;
  Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *local_48;
  long *local_40;
  undefined1 *local_38;
  
  local_38 = (undefined1 *)&local_78;
  local_68 = *(long *)this;
  local_60 = *(long *)(this + 8) - local_68 >> 4;
  puVar2 = (undefined8 *)(local_68 + pos * 0x10);
  local_78 = *puVar2;
  uStack_70 = puVar2[1];
  local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236980;
  row = (uint)pos;
  local_50 = (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *)
             CONCAT44(local_50._4_4_,row);
  local_48 = this + 0x20;
  local_40 = &local_68;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),row,&local_58);
  local_68 = *(long *)this;
  local_60 = *(long *)(this + 8) - local_68 >> 4;
  sVar1 = local_60 - 1;
  if (sVar1 != pos) {
    puVar2 = (undefined8 *)(local_68 + sVar1 * 0x10);
    local_78 = *puVar2;
    uStack_70 = puVar2[1];
    local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236940;
    local_50 = this + 0x20;
    local_48 = (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *)
               &local_68;
    local_40 = &local_78;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)sVar1,row,&local_58);
    puVar2 = (undefined8 *)(*(long *)this + sVar1 * 0x10);
    uVar4 = puVar2[1];
    puVar3 = (undefined8 *)(*(long *)this + pos * 0x10);
    *puVar3 = *puVar2;
    puVar3[1] = uVar4;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}